

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O3

Scaler * __thiscall CoreML::Specification::Scaler::New(Scaler *this,Arena *arena)

{
  Scaler *this_00;
  
  this_00 = (Scaler *)operator_new(0x40);
  Scaler(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::Scaler>(arena,this_00);
  }
  return this_00;
}

Assistant:

Scaler* Scaler::New(::google::protobuf::Arena* arena) const {
  Scaler* n = new Scaler;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}